

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TempInputText
               (ImRect *bb,ImGuiID id,char *label,char *buf,int buf_size,ImGuiInputTextFlags flags)

{
  ImGuiID IVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  IVar1 = GImGui->TempInputId;
  if (IVar1 != id) {
    ClearActiveID();
  }
  (pIVar2->CurrentWindow->DC).CursorPos = bb->Min;
  local_38.x = (bb->Max).x - (bb->Min).x;
  local_38.y = (bb->Max).y - (bb->Min).y;
  bVar3 = InputTextEx(label,(char *)0x0,buf,buf_size,&local_38,flags | 0x10000000,
                      (ImGuiInputTextCallback)0x0,(void *)0x0);
  if (IVar1 != id) {
    if (pIVar2->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                    ,0xd2e,
                    "bool ImGui::TempInputText(const ImRect &, ImGuiID, const char *, char *, int, ImGuiInputTextFlags)"
                   );
    }
    pIVar2->TempInputId = id;
  }
  return bVar3;
}

Assistant:

bool ImGui::TempInputText(const ImRect& bb, ImGuiID id, const char* label, char* buf, int buf_size, ImGuiInputTextFlags flags)
{
    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    ImGuiContext& g = *GImGui;
    const bool init = (g.TempInputId != id);
    if (init)
        ClearActiveID();

    g.CurrentWindow->DC.CursorPos = bb.Min;
    bool value_changed = InputTextEx(label, NULL, buf, buf_size, bb.GetSize(), flags | ImGuiInputTextFlags_MergedItem);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputId = g.ActiveId;
    }
    return value_changed;
}